

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Status.hpp
# Opt level: O0

bool __thiscall InstructionSet::M68k::Status::set_status(Status *this,uint16_t status)

{
  uint16_t status_local;
  Status *this_local;
  
  set_ccr(this,status);
  this->interrupt_level = (int)(uint)status >> 8 & 7;
  this->trace_flag = (long)(int)(status & 0x8000);
  this->is_supervisor = (status & 0x2000) != 0;
  return (bool)(this->is_supervisor & 1);
}

Assistant:

constexpr bool set_status(uint16_t status) {
		set_ccr(status);

		interrupt_level	= (status >> 8) & 7;
		trace_flag		= status & ConditionCode::Trace;
		is_supervisor	= status & ConditionCode::Supervisor;

		return is_supervisor;
	}